

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall test_upscale::build_graph(test_upscale *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  
  pgVar1 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,(this->ne)._M_elems);
  ggml_set_name(pgVar1,"a");
  if (this->transpose == true) {
    pgVar1 = (ggml_tensor *)ggml_transpose(ctx,pgVar1);
    ggml_set_name(pgVar1,"a_transposed");
  }
  pgVar1 = (ggml_tensor *)ggml_upscale(ctx,pgVar1,this->scale_factor,this->mode);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_name(a, "a");

        if (transpose) {
            a = ggml_transpose(ctx, a);
            ggml_set_name(a, "a_transposed");
        }

        ggml_tensor * out = ggml_upscale(ctx, a, scale_factor, mode);
        ggml_set_name(out, "out");

        return out;
    }